

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::SchemaGrammar::putElemDecl
          (SchemaGrammar *this,XMLElementDecl *elemDecl,bool notDeclared)

{
  uint uVar1;
  uint uVar2;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *pRVar3;
  XMLCh *pXVar4;
  bool notDeclared_local;
  XMLElementDecl *elemDecl_local;
  SchemaGrammar *this_local;
  
  if (notDeclared) {
    if (this->fElemNonDeclPool ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar3 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x40,this->fMemoryManager);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(pRVar3,0x1d,true,0x80,this->fMemoryManager);
      this->fElemNonDeclPool = pRVar3;
    }
    pRVar3 = this->fElemNonDeclPool;
    pXVar4 = XMLElementDecl::getBaseName(elemDecl);
    uVar1 = XMLElementDecl::getURI(elemDecl);
    uVar2 = SchemaElementDecl::getEnclosingScope((SchemaElementDecl *)elemDecl);
    this_local = (SchemaGrammar *)
                 RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                           (pRVar3,pXVar4,uVar1,uVar2,(SchemaElementDecl *)elemDecl);
  }
  else {
    pRVar3 = this->fElemDeclPool;
    pXVar4 = XMLElementDecl::getBaseName(elemDecl);
    uVar1 = XMLElementDecl::getURI(elemDecl);
    uVar2 = SchemaElementDecl::getEnclosingScope((SchemaElementDecl *)elemDecl);
    this_local = (SchemaGrammar *)
                 RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                           (pRVar3,pXVar4,uVar1,uVar2,(SchemaElementDecl *)elemDecl);
  }
  return (XMLSize_t)this_local;
}

Assistant:

inline XMLSize_t
SchemaGrammar::putElemDecl(XMLElementDecl* const elemDecl,
                           const bool notDeclared)
{
    if (notDeclared)
    {
        if(!fElemNonDeclPool)
            fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        return fElemNonDeclPool->put(elemDecl->getBaseName(), elemDecl->getURI(), ((SchemaElementDecl* )elemDecl)->getEnclosingScope(), (SchemaElementDecl*) elemDecl);
    }

    return fElemDeclPool->put(elemDecl->getBaseName(), elemDecl->getURI(), ((SchemaElementDecl* )elemDecl)->getEnclosingScope(), (SchemaElementDecl*) elemDecl);
}